

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<FunctionDef>::copyAppend
          (QGenericArrayOps<FunctionDef> *this,FunctionDef *b,FunctionDef *e)

{
  FunctionDef *pFVar1;
  Data *pDVar2;
  Data *pDVar3;
  FunctionDef *pFVar4;
  TypeTags TVar5;
  Token TVar6;
  ReferenceType RVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  bool bVar16;
  long lVar17;
  
  if ((b != e) && (b < e)) {
    pFVar1 = (this->super_QArrayDataPointer<FunctionDef>).ptr;
    lVar17 = (this->super_QArrayDataPointer<FunctionDef>).size;
    do {
      pDVar2 = (b->type).name.d.d;
      pFVar1[lVar17].type.name.d.d = pDVar2;
      pFVar1[lVar17].type.name.d.ptr = (b->type).name.d.ptr;
      pFVar1[lVar17].type.name.d.size = (b->type).name.d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar2->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar2 = (b->type).rawName.d.d;
      pFVar1[lVar17].type.rawName.d.d = pDVar2;
      pFVar1[lVar17].type.rawName.d.ptr = (b->type).rawName.d.ptr;
      pFVar1[lVar17].type.rawName.d.size = (b->type).rawName.d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      TVar5.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
           (b->type).typeTag.super_QFlagsStorageHelper<TypeTag,_4>;
      TVar6 = (b->type).firstToken;
      RVar7 = (b->type).referenceType;
      *(undefined4 *)&pFVar1[lVar17].type.field_0x30 = *(undefined4 *)&(b->type).field_0x30;
      pFVar1[lVar17].type.typeTag =
           (TypeTags)TVar5.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i;
      pFVar1[lVar17].type.firstToken = TVar6;
      pFVar1[lVar17].type.referenceType = RVar7;
      pDVar3 = (b->arguments).d.d;
      pFVar1[lVar17].arguments.d.d = pDVar3;
      pFVar1[lVar17].arguments.d.ptr = (b->arguments).d.ptr;
      pFVar1[lVar17].arguments.d.size = (b->arguments).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->normalizedType).d.d;
      pFVar1[lVar17].normalizedType.d.d = pDVar2;
      pFVar1[lVar17].normalizedType.d.ptr = (b->normalizedType).d.ptr;
      pFVar1[lVar17].normalizedType.d.size = (b->normalizedType).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->tag).d.d;
      pFVar1[lVar17].tag.d.d = pDVar2;
      pFVar1[lVar17].tag.d.ptr = (b->tag).d.ptr;
      pFVar1[lVar17].tag.d.size = (b->tag).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->name).d.d;
      pFVar1[lVar17].name.d.d = pDVar2;
      pFVar1[lVar17].name.d.ptr = (b->name).d.ptr;
      pFVar1[lVar17].name.d.size = (b->name).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->inPrivateClass).d.d;
      pFVar1[lVar17].inPrivateClass.d.d = pDVar2;
      pFVar1[lVar17].inPrivateClass.d.ptr = (b->inPrivateClass).d.ptr;
      pFVar1[lVar17].inPrivateClass.d.size = (b->inPrivateClass).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      bVar8 = b->isSlot;
      bVar9 = b->isSignal;
      bVar10 = b->isPrivateSignal;
      bVar11 = b->isConstructor;
      bVar12 = b->isDestructor;
      bVar13 = b->isAbstract;
      bVar14 = b->isRawSlot;
      pFVar4 = pFVar1 + lVar17;
      pFVar4->isScriptable = b->isScriptable;
      pFVar4->isSlot = bVar8;
      pFVar4->isSignal = bVar9;
      pFVar4->isPrivateSignal = bVar10;
      pFVar4->isConstructor = bVar11;
      pFVar4->isDestructor = bVar12;
      pFVar4->isAbstract = bVar13;
      pFVar4->isRawSlot = bVar14;
      iVar15 = b->revision;
      bVar8 = b->isConst;
      bVar9 = b->isVirtual;
      bVar10 = b->isStatic;
      bVar11 = b->inlineCode;
      bVar12 = b->wasCloned;
      bVar13 = b->returnTypeIsVolatile;
      bVar14 = b->isCompat;
      bVar16 = b->isInvokable;
      pFVar1[lVar17].access = b->access;
      pFVar1[lVar17].revision = iVar15;
      pFVar4 = pFVar1 + lVar17;
      pFVar4->isConst = bVar8;
      pFVar4->isVirtual = bVar9;
      pFVar4->isStatic = bVar10;
      pFVar4->inlineCode = bVar11;
      pFVar4->wasCloned = bVar12;
      pFVar4->returnTypeIsVolatile = bVar13;
      pFVar4->isCompat = bVar14;
      pFVar4->isInvokable = bVar16;
      b = b + 1;
      lVar17 = (this->super_QArrayDataPointer<FunctionDef>).size + 1;
      (this->super_QArrayDataPointer<FunctionDef>).size = lVar17;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }